

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBreak * AnalyzeBreak(ExpressionContext *ctx,SynBreak *syntax)

{
  SynNumber *source;
  TypeBase *pTVar1;
  ScopeData *scopeData;
  int iVar2;
  ExprBase *pEVar3;
  undefined4 extraout_var;
  FunctionData *onwerFunction;
  char *msg;
  ExpressionContext *this;
  uint depth;
  _func_int **pp_Var5;
  ExprBreak *pEVar4;
  
  if (syntax->number == (SynNumber *)0x0) {
    pp_Var5 = (_func_int **)0x1;
  }
  else {
    pEVar3 = AnalyzeExpression(ctx,&syntax->number->super_SynBase);
    source = syntax->number;
    pEVar3 = CreateCast(ctx,&source->super_SynBase,pEVar3,ctx->typeLong,false);
    pEVar3 = anon_unknown.dwarf_b837c::EvaluateExpression(ctx,&source->super_SynBase,pEVar3);
    if ((pEVar3 == (ExprBase *)0x0) || (pEVar3->typeID != 6)) {
      syntax = (SynBreak *)syntax->number;
      msg = "ERROR: break statement must be followed by \';\' or a constant";
      goto LAB_00175586;
    }
    pp_Var5 = pEVar3[1]._vptr_ExprBase;
    if ((long)pp_Var5 < 1) {
      syntax = (SynBreak *)syntax->number;
      msg = "ERROR: break level can\'t be negative or zero";
      goto LAB_00175586;
    }
  }
  depth = (uint)pp_Var5;
  if (depth <= ctx->scope->breakDepth) {
    this = (ExpressionContext *)ctx->allocator;
    iVar2 = (*(*(_func_int ***)this)[2])(this,0x38);
    pEVar4 = (ExprBreak *)CONCAT44(extraout_var,iVar2);
    pTVar1 = ctx->typeVoid;
    scopeData = ctx->scope;
    onwerFunction = ExpressionContext::GetCurrentFunction(this,scopeData);
    pEVar3 = CreateBreakUpvalueClose(ctx,&syntax->super_SynBase,onwerFunction,scopeData,depth);
    (pEVar4->super_ExprBase).typeID = 0x34;
    (pEVar4->super_ExprBase).source = &syntax->super_SynBase;
    (pEVar4->super_ExprBase).type = pTVar1;
    (pEVar4->super_ExprBase).next = (ExprBase *)0x0;
    (pEVar4->super_ExprBase).listed = false;
    (pEVar4->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_002413b0;
    *(uint *)&(pEVar4->super_ExprBase).field_0x2c = depth;
    pEVar4->closures = pEVar3;
    return pEVar4;
  }
  msg = "ERROR: break level is greater that loop depth";
LAB_00175586:
  anon_unknown.dwarf_b837c::Stop(ctx,&syntax->super_SynBase,msg);
}

Assistant:

ExprBreak* AnalyzeBreak(ExpressionContext &ctx, SynBreak *syntax)
{
	unsigned depth = 1;

	if(syntax->number)
	{
		ExprBase *numberValue = AnalyzeExpression(ctx, syntax->number);

		if(ExprIntegerLiteral *number = getType<ExprIntegerLiteral>(EvaluateExpression(ctx, syntax->number, CreateCast(ctx, syntax->number, numberValue, ctx.typeLong, false))))
		{
			if(number->value <= 0)
				Stop(ctx, syntax->number, "ERROR: break level can't be negative or zero");

			depth = unsigned(number->value);
		}
		else
		{
			Stop(ctx, syntax->number, "ERROR: break statement must be followed by ';' or a constant");
		}
	}

	if(ctx.scope->breakDepth < depth)
		Stop(ctx, syntax, "ERROR: break level is greater that loop depth");

	return new (ctx.get<ExprBreak>()) ExprBreak(syntax, ctx.typeVoid, depth, CreateBreakUpvalueClose(ctx, syntax, ctx.GetCurrentFunction(ctx.scope), ctx.scope, depth));
}